

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

void wabt::anon_unknown_0::FloatWriter<float>::WriteHex(char *out,size_t size,Uint bits)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  char *__dest;
  bool bVar4;
  undefined1 local_6a;
  size_t local_68;
  size_t len;
  int nybble_1;
  Uint leading_zeroes;
  int iStack_50;
  bool is_zero;
  Uint nybble;
  int num_nybbles;
  Uint sig;
  int exp;
  bool is_neg;
  char *p;
  char buffer [20];
  Uint bits_local;
  size_t size_local;
  char *out_local;
  
  _exp = &p;
  num_nybbles = (bits >> 0x17 & 0xff) - 0x7f;
  uVar2 = bits & 0x7fffff;
  if ((int)bits < 0) {
    _exp = (char **)((long)&p + 1);
    p._0_1_ = 0x2d;
  }
  if (num_nybbles == 0x80) {
    if (uVar2 == 0) {
      strcpy((char *)_exp,"inf");
      pcVar1 = (char *)((long)_exp + 3);
    }
    else {
      strcpy((char *)_exp,"nan");
      pcVar1 = (char *)((long)_exp + 3);
      if (uVar2 != 0x400000) {
        strcpy((char *)((long)_exp + 3),":0x");
        _exp = (char **)((long)_exp + 6);
        iStack_50 = 8;
        for (nybble = uVar2; (nybble & 0xf0000000) == 0; nybble = nybble << 4) {
          iStack_50 = iStack_50 + -1;
        }
        for (; pcVar1 = (char *)_exp, iStack_50 != 0; iStack_50 = iStack_50 + -1) {
          *(char *)_exp = "0123456789abcdef"[nybble >> 0x1c];
          nybble = nybble << 4;
          _exp = (char **)((long)_exp + 1);
        }
      }
    }
  }
  else {
    bVar4 = num_nybbles != -0x7f;
    strcpy((char *)_exp,"0x");
    local_6a = 0x30;
    if (uVar2 != 0 || bVar4) {
      local_6a = 0x31;
    }
    *(undefined1 *)((long)_exp + 2) = local_6a;
    nybble = uVar2 << 9;
    pcVar1 = (char *)((long)_exp + 3);
    if (uVar2 != 0) {
      if (num_nybbles == -0x7f) {
        uVar3 = Clz(nybble);
        if (uVar3 < 0x1f) {
          nybble = nybble << ((char)uVar3 + 1U & 0x1f);
        }
        else {
          nybble = 0;
        }
        num_nybbles = -0x7f - uVar3;
      }
      *(char *)((long)_exp + 3) = '.';
      _exp = (char **)((long)_exp + 4);
      for (; pcVar1 = (char *)_exp, nybble != 0; nybble = nybble << 4) {
        *(char *)_exp = "0123456789abcdef"[(int)(nybble >> 0x1c)];
        _exp = (char **)((long)_exp + 1);
      }
    }
    _exp = (char **)pcVar1;
    pcVar1 = (char *)_exp;
    __dest = (char *)((long)_exp + 1);
    *(char *)_exp = 'p';
    if (uVar2 != 0 || bVar4) {
      if (num_nybbles < 0) {
        *__dest = '-';
        num_nybbles = -num_nybbles;
      }
      else {
        *__dest = '+';
      }
      _exp = (char **)((long)_exp + 2);
      if (999 < num_nybbles) {
        *(char *)_exp = '1';
        _exp = (char **)(pcVar1 + 3);
      }
      if (99 < num_nybbles) {
        *(char *)_exp =
             (char)((long)((ulong)(uint)((int)((long)num_nybbles / 100) >> 0x1f) << 0x20 |
                          (long)num_nybbles / 100 & 0xffffffffU) % 10) + '0';
        _exp = (char **)((long)_exp + 1);
      }
      if (9 < num_nybbles) {
        *(char *)_exp =
             (char)((long)((ulong)(uint)((int)((long)num_nybbles / 10) >> 0x1f) << 0x20 |
                          (long)num_nybbles / 10 & 0xffffffffU) % 10) + '0';
        _exp = (char **)((long)_exp + 1);
      }
      *(char *)_exp = (char)(num_nybbles % 10) + '0';
      pcVar1 = (char *)((long)_exp + 1);
    }
    else {
      strcpy(__dest,"+0");
      pcVar1 = (char *)((long)_exp + 3);
    }
  }
  _exp = (char **)pcVar1;
  local_68 = (long)_exp - (long)&p;
  if (size <= local_68) {
    local_68 = size - 1;
  }
  memcpy(out,&p,local_68);
  out[local_68] = '\0';
  return;
}

Assistant:

void FloatWriter<T>::WriteHex(char* out, size_t size, Uint bits) {
  static constexpr int kNumNybbles = Traits::kBits / 4;
  static constexpr int kTopNybbleShift = Traits::kBits - 4;
  static constexpr Uint kTopNybble = Uint(0xf) << kTopNybbleShift;
  static const char s_hex_digits[] = "0123456789abcdef";

  char buffer[Traits::kMaxHexBufferSize];
  char* p = buffer;
  bool is_neg = (bits >> Traits::kSignShift);
  int exp = ((bits >> Traits::kSigBits) & Traits::kExpMask) - Traits::kExpBias;
  Uint sig = bits & Traits::kSigMask;

  if (is_neg) {
    *p++ = '-';
  }
  if (exp == Traits::kMaxExp) {
    // Infinity or nan.
    if (sig == 0) {
      strcpy(p, "inf");
      p += 3;
    } else {
      strcpy(p, "nan");
      p += 3;
      if (sig != Traits::kQuietNanTag) {
        strcpy(p, ":0x");
        p += 3;
        // Skip leading zeroes.
        int num_nybbles = kNumNybbles;
        while ((sig & kTopNybble) == 0) {
          sig <<= 4;
          num_nybbles--;
        }
        while (num_nybbles) {
          Uint nybble = (sig >> kTopNybbleShift) & 0xf;
          *p++ = s_hex_digits[nybble];
          sig <<= 4;
          --num_nybbles;
        }
      }
    }
  } else {
    bool is_zero = sig == 0 && exp == Traits::kMinExp;
    strcpy(p, "0x");
    p += 2;
    *p++ = is_zero ? '0' : '1';

    // Shift sig up so the top 4-bits are at the top of the Uint.
    sig <<= Traits::kBits - Traits::kSigBits;

    if (sig) {
      if (exp == Traits::kMinExp) {
        // Subnormal; shift the significand up, and shift out the implicit 1.
        Uint leading_zeroes = Clz(sig);
        if (leading_zeroes < Traits::kSignShift) {
          sig <<= leading_zeroes + 1;
        } else {
          sig = 0;
        }
        exp -= leading_zeroes;
      }

      *p++ = '.';
      while (sig) {
        int nybble = (sig >> kTopNybbleShift) & 0xf;
        *p++ = s_hex_digits[nybble];
        sig <<= 4;
      }
    }
    *p++ = 'p';
    if (is_zero) {
      strcpy(p, "+0");
      p += 2;
    } else {
      if (exp < 0) {
        *p++ = '-';
        exp = -exp;
      } else {
        *p++ = '+';
      }
      if (exp >= 1000) {
        *p++ = '1';
      }
      if (exp >= 100) {
        *p++ = '0' + (exp / 100) % 10;
      }
      if (exp >= 10) {
        *p++ = '0' + (exp / 10) % 10;
      }
      *p++ = '0' + exp % 10;
    }
  }

  size_t len = p - buffer;
  if (len >= size) {
    len = size - 1;
  }
  memcpy(out, buffer, len);
  out[len] = '\0';
}